

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

string * cmQtAutoGen::GeneratorName_abi_cxx11_(GenT genType)

{
  int iVar1;
  string *psVar2;
  
  if (GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_);
    if (iVar1 != 0) {
      GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_,
                 "AutoGen","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_);
    }
  }
  if (GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_);
    if (iVar1 != 0) {
      GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_,
                 "AutoMoc","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_);
    }
  }
  if (GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_);
    if (iVar1 != 0) {
      GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_,
                 "AutoUic","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_);
    }
  }
  if (GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_);
    if (iVar1 != 0) {
      GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_,
                 "AutoRcc","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_);
    }
  }
  if (genType - MOC < 3) {
    psVar2 = (string *)(&PTR_AutoMoc_abi_cxx11__0063f008)[genType - MOC];
  }
  else {
    psVar2 = &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_;
  }
  return psVar2;
}

Assistant:

std::string const& cmQtAutoGen::GeneratorName(GenT genType)
{
  static const std::string AutoGen("AutoGen");
  static const std::string AutoMoc("AutoMoc");
  static const std::string AutoUic("AutoUic");
  static const std::string AutoRcc("AutoRcc");

  switch (genType) {
    case GenT::GEN:
      return AutoGen;
    case GenT::MOC:
      return AutoMoc;
    case GenT::UIC:
      return AutoUic;
    case GenT::RCC:
      return AutoRcc;
  }
  return AutoGen;
}